

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O1

_Bool GPU_SaveImage_RW(GPU_Image *image,SDL_RWops *rwops,_Bool free_rwops,GPU_FileFormatEnum format)

{
  _Bool _Var1;
  SDL_Surface *surface;
  
  if ((_gpu_current_renderer == (GPU_Renderer *)0x0) ||
     (_gpu_current_renderer->current_context_target == (GPU_Target *)0x0)) {
    _Var1 = false;
  }
  else {
    surface = (*_gpu_current_renderer->impl->CopySurfaceFromImage)(_gpu_current_renderer,image);
    _Var1 = GPU_SaveSurface_RW(surface,rwops,free_rwops,format);
    SDL_FreeSurface(surface);
  }
  return _Var1;
}

Assistant:

GPU_bool GPU_SaveImage_RW(GPU_Image* image, SDL_RWops* rwops, GPU_bool free_rwops, GPU_FileFormatEnum format)
{
    GPU_bool result;
    if(_gpu_current_renderer == NULL || _gpu_current_renderer->current_context_target == NULL)
        return GPU_FALSE;

    SDL_Surface* surface = GPU_CopySurfaceFromImage(image);
    result = GPU_SaveSurface_RW(surface, rwops, free_rwops, format);
    SDL_FreeSurface(surface);
    return result;
}